

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O0

time_type asio::detail::
          chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>
          ::add(time_type *t,duration_type *d)

{
  bool bVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  time_type epoch;
  duration_type *d_local;
  time_type *t_local;
  
  epoch.__d.__r = (duration)(duration)d;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_28);
  bVar1 = std::chrono::operator>=(t,&local_28);
  if (bVar1) {
    local_38 = std::chrono::
               time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ::max();
    local_30.__r = (rep)std::chrono::operator-(&local_38,t);
    bVar1 = std::chrono::operator<
                      (&local_30,(duration<long,_std::ratio<1L,_1000000000L>_> *)epoch.__d.__r);
    if (bVar1) {
      tVar2 = std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::max();
      return (duration)tVar2.__d.__r;
    }
  }
  else {
    local_50 = std::chrono::
               time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ::min();
    local_48.__r = (rep)std::chrono::operator-(t,&local_50);
    local_40 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-(&local_48);
    bVar1 = std::chrono::operator>
                      (&local_40,(duration<long,_std::ratio<1L,_1000000000L>_> *)epoch.__d.__r);
    if (bVar1) {
      tVar2 = std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::min();
      return (duration)tVar2.__d.__r;
    }
  }
  tVar2 = std::chrono::operator+(t,(duration<long,_std::ratio<1L,_1000000000L>_> *)epoch.__d.__r);
  return (duration)tVar2.__d.__r;
}

Assistant:

static time_type add(const time_type& t, const duration_type& d)
  {
    const time_type epoch;
    if (t >= epoch)
    {
      if ((time_type::max)() - t < d)
        return (time_type::max)();
    }
    else // t < epoch
    {
      if (-(t - (time_type::min)()) > d)
        return (time_type::min)();
    }

    return t + d;
  }